

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_graph.cpp
# Opt level: O0

void __thiscall indigox::ElectronGraph::ElectronGraph(ElectronGraph *this,MolecularGraph *G)

{
  EdgeType e;
  EdgeType e_00;
  MolEdge e_01;
  VertIterPair VVar1;
  bool bVar2;
  element_type *peVar4;
  type_conflict tVar3;
  mapped_type *ppvVar5;
  property_type *in_RSI;
  void *in_RDI;
  VertIterPair VVar6;
  __enable_if_t<is_constructible<value_type,_pair<void_*,_void_*>_&&>::value,_pair<iterator,_bool>_>
  _Var7;
  EdgeIterPair EVar8;
  pair<void_*,_void_*> pVar9;
  pair<void_*,_void_*> pVar10;
  ElnVertex e_vert_1;
  ElnVertProp e_prop_1;
  ElnVertex v_eln;
  ElnVertex u_eln;
  MolVertex v;
  MolVertex u;
  MolEdgeIter b_1;
  MolEdgeIterPair edges;
  ElnVertex e_vert;
  ElnVertProp e_prop;
  MolVertProp prop;
  MolVertexIter b;
  uint16_t count;
  MolVertIterPair vertices;
  unordered_map<void_*,_void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_void_*>_>_>
  mol2eln;
  Atom *in_stack_fffffffffffffca8;
  key_type *__k;
  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
  *in_stack_fffffffffffffcb0;
  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph> *pGVar11;
  pair<void_*,_void_*> *in_stack_fffffffffffffcb8;
  Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
  *in_stack_fffffffffffffcc0;
  undefined7 in_stack_fffffffffffffcc8;
  uint8_t in_stack_fffffffffffffccf;
  property_type *in_stack_fffffffffffffcd0;
  ElnVertProp *in_stack_fffffffffffffce8;
  Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
  *in_stack_fffffffffffffcf0;
  MolVertex in_stack_fffffffffffffd10;
  MolecularGraph *in_stack_fffffffffffffd18;
  MolecularGraph *in_stack_fffffffffffffd98;
  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph> *pGStack_1e8;
  pair<void_*,_void_*> *local_1e0;
  pair<void_*,_void_*> local_1d8;
  pair<void_*,_void_*> local_1c8;
  pair<void_*,_void_*> local_1b8;
  undefined1 local_1a2;
  uint8_t local_1a1;
  mapped_type local_198;
  mapped_type local_190;
  key_type *local_188;
  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph> *pGStack_180;
  VertType local_170;
  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph> *pGStack_160;
  VertType local_150;
  _List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_> local_148;
  iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
  local_140;
  _List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_> local_138;
  _Node_iterator_base<std::pair<void_*const,_void_*>,_false> local_130;
  undefined1 local_128;
  pair<void_*,_void_*> local_120;
  VertType local_110;
  pair<void_*,_void_*> local_b8;
  pair<void_*,_void_*> local_a8;
  Float local_98;
  uint8_t local_94;
  uint8_t local_93;
  undefined1 local_92;
  uint8_t local_91;
  uint8_t local_90;
  uint8_t local_8f;
  undefined1 local_8e;
  _List_iterator<void_*> local_70;
  short local_66;
  _List_node_base *local_58;
  _List_iterator<void_*> local_50 [8];
  property_type *local_10;
  
  local_10 = in_RSI;
  utils::Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::
  Graph(in_stack_fffffffffffffcf0);
  std::
  unordered_map<void_*,_void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_void_*>_>_>
  ::unordered_map((unordered_map<void_*,_void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_void_*>_>_>
                   *)0x1708b9);
  VVar6 = utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
          ::GetVertices((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                         *)0x1708c6);
  local_58 = (_List_node_base *)VVar6.first._M_node;
  local_66 = 0;
  VVar1 = VVar6;
  while( true ) {
    local_50[0] = VVar1.second._M_node;
    local_70 = VVar1.first._M_node;
    bVar2 = std::operator!=(&local_70,local_50);
    if (!bVar2) break;
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_fffffffffffffcb0);
    utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
    GetProperties(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    MolVertProp::MolVertProp
              ((MolVertProp *)in_stack_fffffffffffffcb0,(MolVertProp *)in_stack_fffffffffffffca8);
    ElnVertProp::ElnVertProp((ElnVertProp *)0x17098d);
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_fffffffffffffcb0);
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_fffffffffffffcb0);
    pVar9 = std::make_pair<void*&,void*&>
                      ((void **)in_stack_fffffffffffffcb0,(void **)in_stack_fffffffffffffca8);
    local_b8.second = pVar9.second;
    in_stack_fffffffffffffd98 = (MolecularGraph *)pVar9.first;
    local_b8.first = in_stack_fffffffffffffd98;
    std::pair<void_*,_void_*>::operator=(&local_a8,&local_b8);
    local_66 = local_66 + 1;
    std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x170a30);
    Atom::GetElement(in_stack_fffffffffffffca8);
    peVar4 = std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x170a4f);
    local_98 = Element::GetElectronegativity(peVar4);
    std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x170a81);
    std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x170a8e);
    Atom::GetElement(in_stack_fffffffffffffca8);
    peVar4 = std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x170aad);
    local_94 = Element::GetValenceElectronCount(peVar4);
    std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x170ad9);
    std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x170ae6);
    Atom::GetElement(in_stack_fffffffffffffca8);
    peVar4 = std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x170b05);
    local_93 = Element::GetAtomicNumber(peVar4);
    std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x170b31);
    local_92 = 0;
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_fffffffffffffcb0);
    local_91 = PreplaceCount(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x170b8a);
    Atom::GetElement(in_stack_fffffffffffffca8);
    peVar4 = std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x170ba9);
    local_90 = Element::GetOctet(peVar4);
    std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x170bd5);
    std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x170be2);
    Atom::GetElement(in_stack_fffffffffffffca8);
    peVar4 = std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x170c01);
    local_8f = Element::GetHypervalentOctet(peVar4);
    std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x170c2d);
    local_8e = 0;
    local_110 = utils::
                Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                ::AddVertex(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_fffffffffffffcb0);
    pVar9 = std::make_pair<void*&,void*&>
                      ((void **)in_stack_fffffffffffffcb0,(void **)in_stack_fffffffffffffca8);
    local_120 = pVar9;
    _Var7 = std::
            unordered_map<void*,void*,std::hash<void*>,std::equal_to<void*>,std::allocator<std::pair<void*const,void*>>>
            ::insert<std::pair<void*,void*>>
                      ((unordered_map<void_*,_void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_void_*>_>_>
                        *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    local_130._M_cur =
         (__node_type *)
         _Var7.first.super__Node_iterator_base<std::pair<void_*const,_void_*>,_false>._M_cur;
    local_128 = _Var7.second;
    MolVertProp::~MolVertProp((MolVertProp *)0x170d04);
    std::_List_iterator<void_*>::operator++(&local_70);
    VVar1.second._M_node = local_50[0]._M_node;
    VVar1.first._M_node = local_70._M_node;
  }
  EVar8 = utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
          ::GetEdges((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                      *)0x170e17);
  pVar9.second = in_stack_fffffffffffffce8;
  pVar9.first = in_stack_fffffffffffffcf0;
  local_140.m_iterator._M_node =
       (_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>)
       EVar8.first.
       super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
       .m_iterator._M_node;
  while( true ) {
    local_138._M_node =
         (_List_node_base *)
         EVar8.second.
         super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
         .m_iterator._M_node;
    local_148._M_node =
         (_List_node_base *)
         EVar8.first.
         super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
         .m_iterator._M_node;
    tVar3 = boost::iterators::operator!=
                      ((iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
                        *)in_stack_fffffffffffffcc0,
                       (iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
                        *)in_stack_fffffffffffffcb8);
    if (!tVar3) break;
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
    ::operator*((iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
                 *)in_stack_fffffffffffffcb0);
    e.super_edge_base<boost::undirected_tag,_void_*>.m_target._0_7_ = in_stack_fffffffffffffcc8;
    e.super_edge_base<boost::undirected_tag,_void_*>.m_source = in_stack_fffffffffffffcc0;
    e.super_edge_base<boost::undirected_tag,_void_*>.m_target._7_1_ = in_stack_fffffffffffffccf;
    e.m_eproperty = in_stack_fffffffffffffcd0;
    pGVar11 = pGStack_160;
    local_150 = utils::
                Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
                GetSource(pGStack_160,e);
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
    ::operator*((iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
                 *)pGVar11);
    e_00.super_edge_base<boost::undirected_tag,_void_*>.m_target._0_7_ = in_stack_fffffffffffffcc8;
    e_00.super_edge_base<boost::undirected_tag,_void_*>.m_source = in_stack_fffffffffffffcc0;
    e_00.super_edge_base<boost::undirected_tag,_void_*>.m_target._7_1_ = in_stack_fffffffffffffccf;
    e_00.m_eproperty = in_stack_fffffffffffffcd0;
    __k = local_188;
    pGVar11 = pGStack_180;
    local_170 = utils::
                Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
                GetTarget(pGStack_180,e_00);
    ppvVar5 = std::
              unordered_map<void_*,_void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_void_*>_>_>
              ::at((unordered_map<void_*,_void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_void_*>_>_>
                    *)pGVar11,__k);
    local_190 = *ppvVar5;
    ppvVar5 = std::
              unordered_map<void_*,_void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_void_*>_>_>
              ::at((unordered_map<void_*,_void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_void_*>_>_>
                    *)pGVar11,__k);
    local_198 = *ppvVar5;
    ElnVertProp::ElnVertProp((ElnVertProp *)0x170fa4);
    if (local_150 < local_170) {
      pVar9 = std::make_pair<void*&,void*&>((void **)pGVar11,__k);
      local_1c8 = pVar9;
      std::pair<void_*,_void_*>::operator=(&local_1b8,&local_1c8);
    }
    else {
      pVar10 = std::make_pair<void*&,void*&>((void **)pGVar11,__k);
      local_1d8 = pVar10;
      std::pair<void_*,_void_*>::operator=(&local_1b8,&local_1d8);
    }
    local_1a2 = 0;
    in_stack_fffffffffffffcd0 = local_10;
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
    ::operator*((iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
                 *)pGVar11);
    e_01.super_edge_base<boost::undirected_tag,_void_*>.m_target = VVar6.second._M_node._M_node;
    e_01.super_edge_base<boost::undirected_tag,_void_*>.m_source = in_RDI;
    e_01.m_eproperty = VVar6.first._M_node._M_node;
    in_stack_fffffffffffffcb0 = pGStack_1e8;
    in_stack_fffffffffffffcb8 = local_1e0;
    in_stack_fffffffffffffccf = PreplaceCount(in_stack_fffffffffffffd98,e_01);
    local_1a1 = in_stack_fffffffffffffccf;
    in_stack_fffffffffffffcc0 =
         (Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph> *
         )utils::
          Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::
          AddVertex((Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                     *)pVar9.first,(ElnVertProp *)pVar9.second);
    utils::Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
    ::AddEdge(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    utils::Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
    ::AddEdge(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
                  *)in_stack_fffffffffffffcb0);
    EVar8.second.
    super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
    .m_iterator._M_node =
         (iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
          )(iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
            )local_138._M_node;
    EVar8.first.
    super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
    .m_iterator._M_node =
         (iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
          )(iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
            )local_148._M_node;
  }
  std::
  unordered_map<void_*,_void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_void_*>_>_>
  ::~unordered_map((unordered_map<void_*,_void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_void_*>_>_>
                    *)0x171155);
  return;
}

Assistant:

ElectronGraph::ElectronGraph(const MolecularGraph &G)
  : _ElnGraph()
  {
    using namespace std;
    unordered_map<MolVertex, ElnVertex> mol2eln;
    MolVertIterPair vertices = G.GetVertices();
    uint16_t count = 0;
    for (MolVertexIter b = vertices.first; b != vertices.second; ++b) {
      MolVertProp prop = *G.GetProperties(*b);
      ElnVertProp e_prop;
      e_prop.id = make_pair(*b, *b);
      count++;
      e_prop.electronegativity = prop.atom->GetElement()->GetElectronegativity();
      e_prop.valence = prop.atom->GetElement()->GetValenceElectronCount();
      e_prop.atomic_number = prop.atom->GetElement()->GetAtomicNumber();
      e_prop.electron_count = 0;
      e_prop.pre_placed = PreplaceCount(G, *b);
      e_prop.target_octet = prop.atom->GetElement()->GetOctet();
      e_prop.target_hyper_octet = prop.atom->GetElement()->GetHypervalentOctet();
      e_prop.formal_charge = 0;
      
      
      ElnVertex e_vert = AddVertex(e_prop);
      mol2eln.insert(make_pair(*b, e_vert));
    }
    
    MolEdgeIterPair edges = G.GetEdges();
    for (MolEdgeIter b = edges.first; b != edges.second; ++b) {
      MolVertex u = G.GetSource(*b), v = G.GetTarget(*b);
      ElnVertex u_eln = mol2eln.at(u), v_eln = mol2eln.at(v);
      ElnVertProp e_prop;
      if (u < v)
        e_prop.id = make_pair(u, v);
      else
        e_prop.id = make_pair(v, u);
      e_prop.electron_count = 0;
      e_prop.pre_placed = PreplaceCount(G, *b);
      ElnVertex e_vert = AddVertex(e_prop);
      AddEdge(u_eln, e_vert);
      AddEdge(v_eln, e_vert);
    }
  }